

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECS.cpp
# Opt level: O1

void __thiscall CECS::Shutdown(CECS *this)

{
  if (this->pCECS != (sCECS *)0x0) {
    CECS_Shutdown(this->pCECS);
    this->pCECS = (sCECS *)0x0;
  }
  if (this->EcsName != (char *)0x0) {
    free(this->EcsName);
    this->EcsName = (char *)0x0;
  }
  if (this->ModName != (char *)0x0) {
    free(this->ModName);
    this->ModName = (char *)0x0;
  }
  return;
}

Assistant:

void CECS::Shutdown(void) {
	if (pCECS != NULL) { CECS_Shutdown(pCECS); pCECS = NULL; }
	if (EcsName != NULL) { free(EcsName); EcsName = NULL; }
	if (ModName != NULL) { free(ModName); ModName = NULL; }
}